

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O0

void test_create_timer_timerfd_create_fails(void)

{
  cio_error cVar1;
  undefined1 local_48 [4];
  cio_error err;
  cio_timer timer;
  
  timerfd_create_fake.custom_fake = timerfd_create_fails;
  cVar1 = cio_timer_init((cio_timer *)local_48,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (0,(ulong)cio_linux_eventloop_add_fake.call_count,(char *)0x0,0xaa,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)cio_linux_eventloop_register_read_fake.call_count,(char *)0x0,0xab,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0xac,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)cio_linux_eventloop_remove_fake.call_count,(char *)0x0,0xad,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0xa9);
}

Assistant:

static void test_create_timer_timerfd_create_fails(void)
{
	timerfd_create_fake.custom_fake = timerfd_create_fails;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_add_fake.call_count);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_register_read_fake.call_count);
	TEST_ASSERT_EQUAL(0, close_fake.call_count);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_remove_fake.call_count);
}